

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O1

void cm_print_error(char *format,...)

{
  long *plVar1;
  char *__s;
  char in_AL;
  uint uVar2;
  size_t sVar3;
  void *pvVar4;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  long *in_FS_OFFSET;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  va_list ap;
  char buffer [1024];
  undefined1 auStack_528 [8];
  undefined8 local_520;
  undefined8 local_518;
  undefined8 local_510;
  undefined8 local_508;
  undefined8 local_500;
  undefined4 local_4f8;
  undefined8 local_4e8;
  undefined8 local_4d8;
  undefined8 local_4c8;
  undefined8 local_4b8;
  undefined8 local_4a8;
  undefined8 local_498;
  undefined8 local_488;
  __va_list_tag local_478;
  undefined8 local_458;
  undefined1 *puStack_450;
  undefined1 *local_448;
  char local_438 [1032];
  long local_30;
  
  local_478.reg_save_area = auStack_528;
  if (in_AL != '\0') {
    local_4f8 = in_XMM0_Da;
    local_4e8 = in_XMM1_Qa;
    local_4d8 = in_XMM2_Qa;
    local_4c8 = in_XMM3_Qa;
    local_4b8 = in_XMM4_Qa;
    local_4a8 = in_XMM5_Qa;
    local_498 = in_XMM6_Qa;
    local_488 = in_XMM7_Qa;
  }
  local_30 = in_FS_OFFSET[5];
  local_478.overflow_arg_area = &stack0x00000008;
  local_478.gp_offset = 8;
  local_478.fp_offset = 0x30;
  local_520 = in_RSI;
  local_518 = in_RDX;
  local_510 = in_RCX;
  local_508 = in_R8;
  local_500 = in_R9;
  if (cm_error_message_enabled == '\0') {
    local_458 = 0x3000000008;
    local_478.reg_save_area = auStack_528;
    puStack_450 = (undefined1 *)local_478.overflow_arg_area;
    local_448 = auStack_528;
    uVar2 = vsnprintf(local_438,0x400,format,&local_478);
    if (-1 < (int)uVar2) {
      plVar1 = (long *)(*in_FS_OFFSET + -0x110);
      __s = (char *)*plVar1;
      if (__s == (char *)0x0) {
        pvVar4 = calloc(1,(ulong)(uVar2 + 1));
        *plVar1 = (long)pvVar4;
        if (pvVar4 == (void *)0x0) goto LAB_00121225;
        sVar3 = 0;
      }
      else {
        sVar3 = strlen(__s);
        pvVar4 = realloc(__s,uVar2 + sVar3 + 1);
        if (pvVar4 == (void *)0x0) goto LAB_00121225;
        *plVar1 = (long)pvVar4;
      }
      if (uVar2 < 0x400) {
        memcpy((void *)(sVar3 + *plVar1),local_438,(ulong)(uVar2 + 1));
      }
      else {
        vsnprintf((char *)(sVar3 + *plVar1),(ulong)uVar2,format,&local_458);
      }
    }
  }
  else {
    vprint_error(format,&local_478);
  }
LAB_00121225:
  if (in_FS_OFFSET[5] == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void cm_print_error(const char * const format, ...)
{
    va_list args;
    va_start(args, format);
    if (cm_error_message_enabled) {
        vcm_print_error(format, args);
    } else {
        vprint_error(format, args);
    }
    va_end(args);
}